

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

bool kratos::MixedAssignmentVisitor::has_non_port(Generator *context,Var *var)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  
  do {
    bVar1 = var != (Var *)0x0;
    if (var == (Var *)0x0) {
      return bVar1;
    }
    if (var->type_ == Slice) {
      lVar4 = __dynamic_cast(var,&Var::typeinfo,&VarSlice::typeinfo,0);
      puVar5 = (undefined8 *)(lVar4 + 0x270);
    }
    else {
      if (var->type_ != Expression) {
        iVar3 = (*(var->super_IRNode)._vptr_IRNode[0xd])(var);
        if ((Generator *)CONCAT44(extraout_var,iVar3) != context) {
          return var->type_ - Parameter < 0xfffffffe;
        }
        return false;
      }
      lVar4 = __dynamic_cast(var,&Var::typeinfo,&Expr::typeinfo,0);
      bVar2 = has_non_port(context,*(Var **)(lVar4 + 0x278));
      if (bVar2) {
        return bVar1;
      }
      puVar5 = (undefined8 *)(lVar4 + 0x280);
    }
    var = (Var *)*puVar5;
  } while( true );
}

Assistant:

static bool has_non_port(Generator* context, Var* var) {
        if (!var) return false;
        if (var->type() == VarType::Expression) {
            auto* expr = dynamic_cast<Expr*>(var);
            return has_non_port(context, expr->left) || has_non_port(context, expr->right);
        } else if (var->type() == VarType::Slice) {
            auto* slice = dynamic_cast<VarSlice*>(var);
            return has_non_port(context, slice->parent_var);
        } else {
            return var->generator() != context && var->type() != VarType::PortIO &&
                   var->type() != VarType ::ConstValue;
        }
    }